

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::AlterForeignKeyInfo,duckdb::AlterEntryData,std::__cxx11::string_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::PhysicalIndex,true>const&,duckdb::vector<duckdb::PhysicalIndex,true>const&,duckdb::AlterForeignKeyType_const&>
          (duckdb *this,AlterEntryData *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *args_2,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *args_3,vector<duckdb::PhysicalIndex,_true> *args_4,
          vector<duckdb::PhysicalIndex,_true> *args_5,AlterForeignKeyType *args_6)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  AlterForeignKeyInfo *this_00;
  AlterEntryData local_118;
  vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_80;
  string local_68;
  vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> local_48;
  
  this_00 = (AlterForeignKeyInfo *)operator_new(0x100);
  local_118.catalog._M_dataplus._M_p = (pointer)&local_118.catalog.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->catalog)._M_dataplus._M_p;
  paVar1 = &(args->catalog).field_2;
  if (paVar2 == paVar1) {
    local_118.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_118.catalog.field_2._8_4_ = *(undefined4 *)((long)&(args->catalog).field_2 + 8);
    local_118.catalog.field_2._12_4_ = *(undefined4 *)((long)&(args->catalog).field_2 + 0xc);
  }
  else {
    local_118.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_118.catalog._M_dataplus._M_p = (pointer)paVar2;
  }
  local_118.catalog._M_string_length = (args->catalog)._M_string_length;
  local_118.schema._M_dataplus._M_p = (pointer)&local_118.schema.field_2;
  (args->catalog)._M_dataplus._M_p = (pointer)paVar1;
  (args->catalog)._M_string_length = 0;
  (args->catalog).field_2._M_local_buf[0] = '\0';
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->schema)._M_dataplus._M_p;
  paVar1 = &(args->schema).field_2;
  if (paVar2 == paVar1) {
    local_118.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_118.schema.field_2._8_4_ = *(undefined4 *)((long)&(args->schema).field_2 + 8);
    local_118.schema.field_2._12_4_ = *(undefined4 *)((long)&(args->schema).field_2 + 0xc);
  }
  else {
    local_118.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_118.schema._M_dataplus._M_p = (pointer)paVar2;
  }
  local_118.schema._M_string_length = (args->schema)._M_string_length;
  paVar2 = &local_118.name.field_2;
  (args->schema)._M_dataplus._M_p = (pointer)paVar1;
  (args->schema)._M_string_length = 0;
  (args->schema).field_2._M_local_buf[0] = '\0';
  local_118.name._M_dataplus._M_p = (args->name)._M_dataplus._M_p;
  paVar1 = &(args->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p == paVar1) {
    local_118.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_118.name.field_2._8_4_ = *(undefined4 *)((long)&(args->name).field_2 + 8);
    local_118.name.field_2._12_4_ = *(undefined4 *)((long)&(args->name).field_2 + 0xc);
    local_118.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_118.name._M_string_length = (args->name)._M_string_length;
  (args->name)._M_dataplus._M_p = (pointer)paVar1;
  (args->name)._M_string_length = 0;
  (args->name).field_2._M_local_buf[0] = '\0';
  local_118.if_not_found = args->if_not_found;
  pcVar3 = (args_1->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + args_1->_M_string_length);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_80,
           &args_2->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_98,
           &args_3->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::vector
            (&local_b0,
             &args_4->super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>);
  ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::vector
            (&local_48,
             &args_5->super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>);
  AlterForeignKeyInfo::AlterForeignKeyInfo
            (this_00,&local_118,&local_68,&local_80,&local_98,
             (vector<duckdb::PhysicalIndex,_true> *)&local_b0,
             (vector<duckdb::PhysicalIndex,_true> *)&local_48,*args_6);
  *(AlterForeignKeyInfo **)this = this_00;
  if (local_48.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_98);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.schema._M_dataplus._M_p != &local_118.schema.field_2) {
    operator_delete(local_118.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.catalog._M_dataplus._M_p != &local_118.catalog.field_2) {
    operator_delete(local_118.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}